

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjExporter::WriteGeometryFile(ObjExporter *this,bool noMtl)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference paVar5;
  reference pMVar6;
  ulong uVar7;
  reference pFVar8;
  reference pFVar9;
  FaceVertex *fv;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
  *__range3;
  Face *f;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_> *__range2_2;
  MeshInstance *m;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  *__range1_2;
  aiVector3D *v_3;
  iterator __end1_1;
  iterator __begin1_1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__range1_1;
  aiVector3D *v_2;
  iterator __end1;
  iterator __begin1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__range1;
  vertexData *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  *__range2_1;
  vertexData *v;
  iterator __end2;
  iterator __begin2;
  vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  *__range2;
  aiMatrix4x4 mBase;
  string local_38;
  byte local_11;
  ObjExporter *pOStack_10;
  bool noMtl_local;
  ObjExporter *this_local;
  
  local_11 = noMtl;
  pOStack_10 = this;
  WriteHeader(this,&this->mOutput);
  if ((local_11 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)this,"mtllib ");
    GetMaterialLibName_abi_cxx11_(&local_38,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    poVar2 = std::operator<<(poVar2,(string *)&this->endl);
    std::operator<<(poVar2,(string *)&this->endl);
    std::__cxx11::string::~string((string *)&local_38);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)((long)&__range2 + 4));
  AddNode(this,this->pScene->mRootNode,(aiMatrix4x4 *)((long)&__range2 + 4));
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::getKeys
            (&this->mVpMap,&this->vp);
  if ((this->useVc & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)this,"# ");
    sVar3 = std::
            vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
            ::size(&this->vp);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," vertex positions");
    std::operator<<(poVar2,(string *)&this->endl);
    __end2 = std::
             vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             ::begin(&this->vp);
    v = (vertexData *)
        std::
        vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
        end(&this->vp);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
                                       *)&v), bVar1) {
      pvVar4 = __gnu_cxx::
               __normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
               ::operator*(&__end2);
      poVar2 = std::operator<<((ostream *)this,"v  ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).x);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).y);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).z);
      std::operator<<(poVar2,(string *)&this->endl);
      __gnu_cxx::
      __normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)this,"# ");
    sVar3 = std::
            vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
            ::size(&this->vp);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," vertex positions and colors");
    std::operator<<(poVar2,(string *)&this->endl);
    __end2_1 = std::
               vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
               ::begin(&this->vp);
    v_1 = (vertexData *)
          std::
          vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
          ::end(&this->vp);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
                               *)&v_1), bVar1) {
      pvVar4 = __gnu_cxx::
               __normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
               ::operator*(&__end2_1);
      poVar2 = std::operator<<((ostream *)this,"v  ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).x);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).y);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vp).z);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vc).r);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vc).g);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pvVar4->vc).b);
      std::operator<<(poVar2,(string *)&this->endl);
      __gnu_cxx::
      __normal_iterator<Assimp::ObjExporter::vertexData_*,_std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>_>
      ::operator++(&__end2_1);
    }
  }
  std::operator<<((ostream *)this,(string *)&this->endl);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVtMap,&this->vt);
  poVar2 = std::operator<<((ostream *)this,"# ");
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(&this->vt);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," UV coordinates");
  std::operator<<(poVar2,(string *)&this->endl);
  __end1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(&this->vt);
  v_2 = (aiVector3D *)
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(&this->vt);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                                     *)&v_2), bVar1) {
    paVar5 = __gnu_cxx::
             __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
             ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)this,"vt ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->x);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->y);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->z);
    std::operator<<(poVar2,(string *)&this->endl);
    __gnu_cxx::
    __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)this,(string *)&this->endl);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVnMap,&this->vn);
  poVar2 = std::operator<<((ostream *)this,"# ");
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(&this->vn);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," vertex normals");
  std::operator<<(poVar2,(string *)&this->endl);
  __end1_1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(&this->vn);
  v_3 = (aiVector3D *)
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(&this->vn);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                             *)&v_3), bVar1) {
    paVar5 = __gnu_cxx::
             __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
             ::operator*(&__end1_1);
    poVar2 = std::operator<<((ostream *)this,"vn ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->x);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->y);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar5->z);
    std::operator<<(poVar2,(string *)&this->endl);
    __gnu_cxx::
    __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)this,(string *)&this->endl);
  __end1_2 = std::
             vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
             ::begin(&this->mMeshes);
  m = (MeshInstance *)
      std::
      vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
      ::end(&this->mMeshes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Assimp::ObjExporter::MeshInstance_*,_std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>_>
                             *)&m), bVar1) {
    pMVar6 = __gnu_cxx::
             __normal_iterator<Assimp::ObjExporter::MeshInstance_*,_std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>_>
             ::operator*(&__end1_2);
    poVar2 = std::operator<<((ostream *)this,"# Mesh \'");
    poVar2 = std::operator<<(poVar2,(string *)pMVar6);
    poVar2 = std::operator<<(poVar2,"\' with ");
    sVar3 = std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::size
                      (&pMVar6->faces);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," faces");
    std::operator<<(poVar2,(string *)&this->endl);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)this,"g ");
      poVar2 = std::operator<<(poVar2,(string *)pMVar6);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    if ((local_11 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)this,"usemtl ");
      poVar2 = std::operator<<(poVar2,(string *)&pMVar6->matname);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    __end2_2 = std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::
               begin(&pMVar6->faces);
    f = (Face *)std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::
                end(&pMVar6->faces);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_Assimp::ObjExporter::Face_*,_std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>_>
                               *)&f), bVar1) {
      pFVar8 = __gnu_cxx::
               __normal_iterator<const_Assimp::ObjExporter::Face_*,_std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>_>
               ::operator*(&__end2_2);
      poVar2 = std::operator<<((ostream *)this,pFVar8->kind);
      std::operator<<(poVar2,' ');
      __end3 = std::
               vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
               ::begin(&pFVar8->indices);
      fv = (FaceVertex *)
           std::
           vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
           ::end(&pFVar8->indices);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Assimp::ObjExporter::FaceVertex_*,_std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>_>
                                         *)&fv), bVar1) {
        pFVar9 = __gnu_cxx::
                 __normal_iterator<const_Assimp::ObjExporter::FaceVertex_*,_std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>_>
                 ::operator*(&__end3);
        poVar2 = std::operator<<((ostream *)this,' ');
        std::ostream::operator<<(poVar2,pFVar9->vp);
        if (pFVar8->kind != 'p') {
          if ((pFVar9->vt != 0) || (pFVar8->kind == 'f')) {
            std::operator<<((ostream *)this,'/');
          }
          if (pFVar9->vt != 0) {
            std::ostream::operator<<(this,pFVar9->vt);
          }
          if ((pFVar8->kind == 'f') && (pFVar9->vn != 0)) {
            poVar2 = std::operator<<((ostream *)this,'/');
            std::ostream::operator<<(poVar2,pFVar9->vn);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::ObjExporter::FaceVertex_*,_std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>_>
        ::operator++(&__end3);
      }
      std::operator<<((ostream *)this,(string *)&this->endl);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ObjExporter::Face_*,_std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>_>
      ::operator++(&__end2_2);
    }
    std::operator<<((ostream *)this,(string *)&this->endl);
    __gnu_cxx::
    __normal_iterator<Assimp::ObjExporter::MeshInstance_*,_std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>_>
    ::operator++(&__end1_2);
  }
  return;
}

Assistant:

void ObjExporter::WriteGeometryFile(bool noMtl) {
    WriteHeader(mOutput);
    if (!noMtl)
        mOutput << "mtllib "  << GetMaterialLibName() << endl << endl;

    // collect mesh geometry
    aiMatrix4x4 mBase;
    AddNode(pScene->mRootNode, mBase);

    // write vertex positions with colors, if any
    mVpMap.getKeys( vp );
    if ( !useVc ) {
        mOutput << "# " << vp.size() << " vertex positions" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << endl;
        }
    } else {
        mOutput << "# " << vp.size() << " vertex positions and colors" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << " " << v.vc.r << " " << v.vc.g << " " << v.vc.b << endl;
        }
    }
    mOutput << endl;

    // write uv coordinates
    mVtMap.getKeys(vt);
    mOutput << "# " << vt.size() << " UV coordinates" << endl;
    for(const aiVector3D& v : vt) {
        mOutput << "vt " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // write vertex normals
    mVnMap.getKeys(vn);
    mOutput << "# " << vn.size() << " vertex normals" << endl;
    for(const aiVector3D& v : vn) {
        mOutput << "vn " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // now write all mesh instances
    for(const MeshInstance& m : mMeshes) {
        mOutput << "# Mesh \'" << m.name << "\' with " << m.faces.size() << " faces" << endl;
        if (!m.name.empty()) {
            mOutput << "g " << m.name << endl;
        }
        if ( !noMtl ) {
            mOutput << "usemtl " << m.matname << endl;
        }

        for(const Face& f : m.faces) {
            mOutput << f.kind << ' ';
            for(const FaceVertex& fv : f.indices) {
                mOutput << ' ' << fv.vp;

                if (f.kind != 'p') {
                    if (fv.vt || f.kind == 'f') {
                        mOutput << '/';
                    }
                    if (fv.vt) {
                        mOutput << fv.vt;
                    }
                    if (f.kind == 'f' && fv.vn) {
                        mOutput << '/' << fv.vn;
                    }
                }
            }

            mOutput << endl;
        }
        mOutput << endl;
    }
}